

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManSeqEquivDivide(Gia_Man_t *p,Cec_ParCor_t *pPars)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *pAig;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  Gia_Man_t *pParts [2];
  Gia_Man_t *local_38 [2];
  
  lVar5 = 0;
  do {
    pAig = Gia_ManDupHalfSeq(p,(int)lVar5);
    local_38[lVar5] = pAig;
    Cec_ManLSCorrespondenceClasses(pAig,pPars);
    uVar1 = p->nObjs;
    if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      puVar3 = &p->pObjs->Value;
      uVar4 = 0;
      do {
        uVar2 = *puVar3;
        if (uVar2 != 0xffffffff) {
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (pAig->nObjs <= (int)(uVar2 >> 1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pAig->pObjs[uVar2 >> 1].Value = (uint)uVar4;
        }
        uVar4 = uVar4 + 1;
        puVar3 = puVar3 + 3;
      } while (uVar1 != uVar4);
    }
    bVar6 = lVar5 != 0;
    lVar5 = lVar5 + 1;
    if (bVar6) {
      Gia_ManSeqEquivMerge(p,local_38);
      Gia_ManStop(local_38[0]);
      Gia_ManStop(local_38[1]);
      return;
    }
  } while( true );
}

Assistant:

void Gia_ManSeqEquivDivide( Gia_Man_t * p, Cec_ParCor_t * pPars )
{
    Gia_Man_t * pParts[2];
    Gia_Obj_t * pObj;
    int n, i;
    for ( n = 0; n < 2; n++ )
    {
        // derive n-th part of the AIG
        pParts[n] = Gia_ManDupHalfSeq( p, n );
        //Gia_ManPrintStats( pParts[n], NULL );
        // compute equivalences (recorded internally using pReprs and pNexts)
        Cec_ManLSCorrespondenceClasses( pParts[n], pPars );
        // make the nodes of the part AIG point to their prototypes in the AIG
        Gia_ManForEachObj( p, pObj, i )
            if ( ~pObj->Value )
                Gia_ManObj( pParts[n], Abc_Lit2Var(pObj->Value) )->Value = i;
    }
    Gia_ManSeqEquivMerge( p, pParts );
    Gia_ManStop( pParts[0] );
    Gia_ManStop( pParts[1] );
}